

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O0

void __thiscall
OpenMD::ForceManager::calcSelectedForces(ForceManager *this,Molecule *mol1,Molecule *mol2)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  ForceManager *in_stack_00000280;
  
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    initialize(in_stack_00000280);
  }
  (**(code **)(*in_RDI + 0x48))(in_RDI,in_RSI,in_RDX);
  (**(code **)(*in_RDI + 0x50))(in_RDI,in_RSI,in_RDX);
  (**(code **)(*in_RDI + 0x58))(in_RDI,in_RSI,in_RDX);
  (**(code **)(*in_RDI + 0x60))(in_RDI,in_RSI,in_RDX);
  return;
}

Assistant:

void ForceManager::calcSelectedForces(Molecule* mol1, Molecule* mol2) {
    if (!initialized_) initialize();

    selectedPreCalculation(mol1, mol2);
    selectedShortRangeInteractions(mol1, mol2);
    selectedLongRangeInteractions(mol1, mol2);
    selectedPostCalculation(mol1, mol2);
  }